

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward.hpp
# Opt level: O3

ResolvedTrace * __thiscall
backward::TraceResolverLinuxImpl<backward::trace_resolver_tag::backtrace_symbol>::resolve
          (ResolvedTrace *__return_storage_ptr__,
          TraceResolverLinuxImpl<backward::trace_resolver_tag::backtrace_symbol> *this,
          ResolvedTrace *trace)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  pointer pcVar3;
  size_t sVar4;
  undefined8 uVar5;
  pointer pSVar6;
  uint uVar7;
  byte *pbVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  long lVar10;
  string local_48;
  
  pcVar2 = (this->_symbols)._val[(trace->super_Trace).idx];
  for (lVar10 = 0; (pcVar2[lVar10] != '\0' && (pcVar2[lVar10] != '(')); lVar10 = lVar10 + 1) {
  }
  std::__cxx11::string::replace
            ((ulong)&trace->object_filename,0,(char *)(trace->object_filename)._M_string_length,
             (ulong)pcVar2);
  if (pcVar2[lVar10] != '\0') {
    pbVar8 = (byte *)(pcVar2 + lVar10 + 1);
    while ((0x2b < (ulong)*pbVar8 || ((0xa0000000001U >> ((ulong)*pbVar8 & 0x3f) & 1) == 0))) {
      pbVar8 = pbVar8 + 1;
    }
    *pbVar8 = 0;
    details::demangler_impl<backward::system_tag::linux_tag>::demangle_abi_cxx11_
              (&local_48,
               &(this->super_TraceResolverLinuxBase).super_TraceResolverImplBase._demangler.
                super_demangler_impl<backward::system_tag::linux_tag>,pcVar2 + lVar10 + 1);
    std::__cxx11::string::operator=((string *)&trace->object_function,(string *)&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    std::__cxx11::string::_M_assign((string *)&trace->source);
  }
  sVar4 = (trace->super_Trace).idx;
  (__return_storage_ptr__->super_Trace).addr = (trace->super_Trace).addr;
  (__return_storage_ptr__->super_Trace).idx = sVar4;
  paVar1 = &(__return_storage_ptr__->object_filename).field_2;
  (__return_storage_ptr__->object_filename)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (trace->object_filename)._M_dataplus._M_p;
  paVar9 = &(trace->object_filename).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar9) {
    uVar5 = *(undefined8 *)((long)&(trace->object_filename).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar9->_M_allocated_capacity;
    *(undefined8 *)((long)&(__return_storage_ptr__->object_filename).field_2 + 8) = uVar5;
  }
  else {
    (__return_storage_ptr__->object_filename)._M_dataplus._M_p = pcVar3;
    (__return_storage_ptr__->object_filename).field_2._M_allocated_capacity =
         paVar9->_M_allocated_capacity;
  }
  (__return_storage_ptr__->object_filename)._M_string_length =
       (trace->object_filename)._M_string_length;
  (trace->object_filename)._M_dataplus._M_p = (pointer)paVar9;
  (trace->object_filename)._M_string_length = 0;
  (trace->object_filename).field_2._M_local_buf[0] = '\0';
  paVar1 = &(__return_storage_ptr__->object_function).field_2;
  (__return_storage_ptr__->object_function)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (trace->object_function)._M_dataplus._M_p;
  paVar9 = &(trace->object_function).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar9) {
    uVar5 = *(undefined8 *)((long)&(trace->object_function).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar9->_M_allocated_capacity;
    *(undefined8 *)((long)&(__return_storage_ptr__->object_function).field_2 + 8) = uVar5;
  }
  else {
    (__return_storage_ptr__->object_function)._M_dataplus._M_p = pcVar3;
    (__return_storage_ptr__->object_function).field_2._M_allocated_capacity =
         paVar9->_M_allocated_capacity;
  }
  (__return_storage_ptr__->object_function)._M_string_length =
       (trace->object_function)._M_string_length;
  (trace->object_function)._M_dataplus._M_p = (pointer)paVar9;
  (trace->object_function)._M_string_length = 0;
  (trace->object_function).field_2._M_local_buf[0] = '\0';
  paVar1 = &(__return_storage_ptr__->source).function.field_2;
  (__return_storage_ptr__->source).function._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (trace->source).function._M_dataplus._M_p;
  paVar9 = &(trace->source).function.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar9) {
    uVar5 = *(undefined8 *)((long)&(trace->source).function.field_2 + 8);
    paVar1->_M_allocated_capacity = paVar9->_M_allocated_capacity;
    *(undefined8 *)((long)&(__return_storage_ptr__->source).function.field_2 + 8) = uVar5;
  }
  else {
    (__return_storage_ptr__->source).function._M_dataplus._M_p = pcVar3;
    (__return_storage_ptr__->source).function.field_2._M_allocated_capacity =
         paVar9->_M_allocated_capacity;
  }
  (__return_storage_ptr__->source).function._M_string_length =
       (trace->source).function._M_string_length;
  (trace->source).function._M_dataplus._M_p = (pointer)paVar9;
  (trace->source).function._M_string_length = 0;
  (trace->source).function.field_2._M_local_buf[0] = '\0';
  paVar1 = &(__return_storage_ptr__->source).filename.field_2;
  (__return_storage_ptr__->source).filename._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (trace->source).filename._M_dataplus._M_p;
  paVar9 = &(trace->source).filename.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar9) {
    uVar5 = *(undefined8 *)((long)&(trace->source).filename.field_2 + 8);
    paVar1->_M_allocated_capacity = paVar9->_M_allocated_capacity;
    *(undefined8 *)((long)&(__return_storage_ptr__->source).filename.field_2 + 8) = uVar5;
  }
  else {
    (__return_storage_ptr__->source).filename._M_dataplus._M_p = pcVar3;
    (__return_storage_ptr__->source).filename.field_2._M_allocated_capacity =
         paVar9->_M_allocated_capacity;
  }
  (__return_storage_ptr__->source).filename._M_string_length =
       (trace->source).filename._M_string_length;
  (trace->source).filename._M_dataplus._M_p = (pointer)paVar9;
  (trace->source).filename._M_string_length = 0;
  (trace->source).filename.field_2._M_local_buf[0] = '\0';
  uVar7 = (trace->source).col;
  (__return_storage_ptr__->source).line = (trace->source).line;
  (__return_storage_ptr__->source).col = uVar7;
  pSVar6 = (trace->inliners).
           super__Vector_base<backward::ResolvedTrace::SourceLoc,_std::allocator<backward::ResolvedTrace::SourceLoc>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->inliners).
  super__Vector_base<backward::ResolvedTrace::SourceLoc,_std::allocator<backward::ResolvedTrace::SourceLoc>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (trace->inliners).
       super__Vector_base<backward::ResolvedTrace::SourceLoc,_std::allocator<backward::ResolvedTrace::SourceLoc>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->inliners).
  super__Vector_base<backward::ResolvedTrace::SourceLoc,_std::allocator<backward::ResolvedTrace::SourceLoc>_>
  ._M_impl.super__Vector_impl_data._M_finish = pSVar6;
  (__return_storage_ptr__->inliners).
  super__Vector_base<backward::ResolvedTrace::SourceLoc,_std::allocator<backward::ResolvedTrace::SourceLoc>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (trace->inliners).
       super__Vector_base<backward::ResolvedTrace::SourceLoc,_std::allocator<backward::ResolvedTrace::SourceLoc>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (trace->inliners).
  super__Vector_base<backward::ResolvedTrace::SourceLoc,_std::allocator<backward::ResolvedTrace::SourceLoc>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (trace->inliners).
  super__Vector_base<backward::ResolvedTrace::SourceLoc,_std::allocator<backward::ResolvedTrace::SourceLoc>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (trace->inliners).
  super__Vector_base<backward::ResolvedTrace::SourceLoc,_std::allocator<backward::ResolvedTrace::SourceLoc>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  return __return_storage_ptr__;
}

Assistant:

ResolvedTrace resolve(ResolvedTrace trace) override {
    char *filename = _symbols[trace.idx];
    char *funcname = filename;
    while (*funcname && *funcname != '(') {
      funcname += 1;
    }
    trace.object_filename.assign(filename,
                                 funcname); // ok even if funcname is the ending
                                            // \0 (then we assign entire string)

    if (*funcname) { // if it's not end of string (e.g. from last frame ip==0)
      funcname += 1;
      char *funcname_end = funcname;
      while (*funcname_end && *funcname_end != ')' && *funcname_end != '+') {
        funcname_end += 1;
      }
      *funcname_end = '\0';
      trace.object_function = this->demangle(funcname);
      trace.source.function = trace.object_function; // we cannot do better.
    }
    return trace;
  }